

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::perturbMaxEnter(SPxSolverBase<double> *this)

{
  UpdateVector<double> *this_00;
  SPxSolverBase<double> *this_01;
  SPxSolverBase<double> *in_RDI;
  int in_stack_00000070;
  int in_stack_00000074;
  double in_stack_00000078;
  double in_stack_00000080;
  VectorBase<double> *in_stack_00000088;
  VectorBase<double> *in_stack_00000090;
  UpdateVector<double> *in_stack_00000098;
  SPxSolverBase<double> *in_stack_000000a0;
  SSVectorBase<double> *in_stack_ffffffffffffffd0;
  double local_20;
  double local_18;
  int local_c [3];
  
  local_c[0] = SPxBasisBase<double>::iteration(&in_RDI->super_SPxBasisBase<double>);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
  SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[37],_int,_double,_0>
            (in_RDI,(char (*) [37])"DSHIFT04 iteration= {} perturbing {}",local_c,&local_18);
  this_00 = fVec(in_RDI);
  UpdateVector<double>::delta(this_00);
  SSVectorBase<double>::setup(in_stack_ffffffffffffffd0);
  this_01 = (SPxSolverBase<double> *)fVec(in_RDI);
  lbBound(in_RDI);
  ubBound(in_RDI);
  epsilon((SPxSolverBase<double> *)0x224542);
  entertol(this_01);
  perturbMax(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
  SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[7],_double,_0>
            (in_RDI,(char (*) [7])"\t->{}\n",&local_20);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMaxEnter(void)
{
   SPxOut::debug(this, "DSHIFT04 iteration= {} perturbing {}", this->iteration(), shift());
   fVec().delta().setup();
   perturbMax(fVec(), lbBound(), ubBound(), epsilon(), entertol());
   SPxOut::debug(this, "\t->{}\n", shift());
}